

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::InstanceArrayIntersectorK<4>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  NodeRef *pNVar1;
  undefined4 uVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar5;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  size_t sVar13;
  NodeRef *pNVar14;
  size_t sVar15;
  long lVar16;
  size_t sVar17;
  Primitive_conflict4 *prim;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar18;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar19;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  vint4 ai_2;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  vint4 ai;
  undefined1 auVar26 [16];
  vint4 ai_1;
  undefined1 auVar27 [16];
  vint4 ai_3;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  vint4 bi;
  undefined1 auVar30 [16];
  vint4 bi_1;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  vint4 bi_3;
  undefined1 auVar33 [16];
  vint4 bi_2;
  undefined1 auVar34 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  Precalculations pre;
  vint4 bi_8;
  vbool<4> valid0;
  InstanceArrayIntersectorK<4> local_34e8 [16];
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar25 = vpcmpeqd_avx(in_ZMM10._0_16_,in_ZMM10._0_16_);
    auVar35 = ZEXT1664(auVar25);
    auVar8 = vpcmpeqd_avx(auVar25,(undefined1  [16])valid_i->field_0);
    auVar23 = ZEXT816(0) << 0x40;
    auVar7 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar23,5);
    auVar9 = auVar8 & auVar7;
    if ((((auVar9 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar9 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar9 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar9[0xf] < '\0') {
      auVar9 = vandps_avx(auVar7,auVar8);
      auVar31._8_4_ = 0x7fffffff;
      auVar31._0_8_ = 0x7fffffff7fffffff;
      auVar31._12_4_ = 0x7fffffff;
      auVar7 = vandps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar31);
      auVar34._8_4_ = 0x219392ef;
      auVar34._0_8_ = 0x219392ef219392ef;
      auVar34._12_4_ = 0x219392ef;
      auVar7 = vcmpps_avx(auVar7,auVar34,1);
      auVar8 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar34,auVar7);
      auVar7 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar31);
      auVar7 = vcmpps_avx(auVar7,auVar34,1);
      auVar4 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar34,auVar7);
      auVar7 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar31);
      auVar7 = vcmpps_avx(auVar7,auVar34,1);
      auVar7 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar34,auVar7);
      auVar31 = vrcpps_avx(auVar8);
      auVar28._8_4_ = 0x3f800000;
      auVar28._0_8_ = 0x3f8000003f800000;
      auVar28._12_4_ = 0x3f800000;
      auVar22 = vfnmadd213ps_fma(auVar8,auVar31,auVar28);
      auVar34 = vrcpps_avx(auVar4);
      auVar21 = vfnmadd213ps_fma(auVar4,auVar34,auVar28);
      auVar4 = vrcpps_avx(auVar7);
      auVar28 = vfnmadd213ps_fma(auVar7,auVar4,auVar28);
      auVar7 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar23);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar37 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      aVar5.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar7,auVar9);
      auVar36 = ZEXT1664(CONCAT412(auVar9._12_4_ ^ auVar25._12_4_,
                                   CONCAT48(auVar9._8_4_ ^ auVar25._8_4_,
                                            CONCAT44(auVar9._4_4_ ^ auVar25._4_4_,
                                                     auVar9._0_4_ ^ auVar25._0_4_))));
      auVar7 = *(undefined1 (*) [16])ray;
      auVar25 = *(undefined1 (*) [16])(ray + 0x10);
      auVar8 = *(undefined1 (*) [16])(ray + 0x20);
      auVar23 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar23);
      auVar24._8_4_ = 0xff800000;
      auVar24._0_8_ = 0xff800000ff800000;
      auVar24._12_4_ = 0xff800000;
      bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                     vblendvps_avx(auVar24,auVar23,auVar9);
      auVar23 = vfmadd132ps_fma(auVar21,auVar34,auVar34);
      auVar31 = vfmadd132ps_fma(auVar22,auVar31,auVar31);
      auVar4 = vfmadd132ps_fma(auVar28,auVar4,auVar4);
      pNVar14 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar18 = &stack_near[2].field_0;
      stack_near[1].field_0 = aVar5;
LAB_0164abd1:
      auVar34 = auVar36._0_16_;
      pNVar1 = pNVar14 + -1;
      if (pNVar1->ptr != 0xfffffffffffffff8) {
        pNVar14 = pNVar14 + -1;
        aVar19 = paVar18[-1];
        paVar18 = paVar18 + -1;
        auVar22 = vcmpps_avx((undefined1  [16])aVar19,(undefined1  [16])bi_8.field_0,1);
        sVar17 = pNVar1->ptr;
        if ((((auVar22 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar22 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar22 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar22[0xf] < '\0') {
          do {
            if ((sVar17 & 8) != 0) {
              if (sVar17 == 0xfffffffffffffff8) goto LAB_0164ae21;
              auVar22 = vcmpps_avx((undefined1  [16])bi_8.field_0,(undefined1  [16])aVar19,6);
              if ((((auVar22 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar22 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar22 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar22[0xf] < '\0') {
                aVar20._0_4_ = auVar36._0_4_ ^ auVar35._0_4_;
                aVar20._4_4_ = auVar36._4_4_ ^ auVar35._4_4_;
                aVar20._8_4_ = auVar36._8_4_ ^ auVar35._8_4_;
                aVar20._12_4_ = auVar36._12_4_ ^ auVar35._12_4_;
                lVar16 = (ulong)((uint)sVar17 & 0xf) - 7;
                prim = (Primitive_conflict4 *)(sVar17 & 0xfffffffffffffff0);
                goto LAB_0164ad70;
              }
              break;
            }
            sVar15 = 8;
            aVar19 = auVar37._0_16_;
            for (lVar16 = 0;
                (lVar16 != 8 &&
                (sVar3 = *(size_t *)((sVar17 & 0xfffffffffffffff0) + lVar16 * 8), sVar3 != 8));
                lVar16 = lVar16 + 1) {
              uVar2 = *(undefined4 *)(sVar17 + 0x40 + lVar16 * 4);
              auVar26._4_4_ = uVar2;
              auVar26._0_4_ = uVar2;
              auVar26._8_4_ = uVar2;
              auVar26._12_4_ = uVar2;
              auVar10._4_4_ = auVar31._4_4_ * -auVar7._4_4_;
              auVar10._0_4_ = auVar31._0_4_ * -auVar7._0_4_;
              auVar10._8_4_ = auVar31._8_4_ * -auVar7._8_4_;
              auVar10._12_4_ = auVar31._12_4_ * -auVar7._12_4_;
              auVar28 = vfmadd213ps_fma(auVar26,auVar31,auVar10);
              uVar2 = *(undefined4 *)(sVar17 + 0x80 + lVar16 * 4);
              auVar27._4_4_ = uVar2;
              auVar27._0_4_ = uVar2;
              auVar27._8_4_ = uVar2;
              auVar27._12_4_ = uVar2;
              auVar11._4_4_ = auVar23._4_4_ * -auVar25._4_4_;
              auVar11._0_4_ = auVar23._0_4_ * -auVar25._0_4_;
              auVar11._8_4_ = auVar23._8_4_ * -auVar25._8_4_;
              auVar11._12_4_ = auVar23._12_4_ * -auVar25._12_4_;
              auVar24 = vfmadd213ps_fma(auVar27,auVar23,auVar11);
              uVar2 = *(undefined4 *)(sVar17 + 0xc0 + lVar16 * 4);
              auVar29._4_4_ = uVar2;
              auVar29._0_4_ = uVar2;
              auVar29._8_4_ = uVar2;
              auVar29._12_4_ = uVar2;
              auVar12._4_4_ = auVar4._4_4_ * -auVar8._4_4_;
              auVar12._0_4_ = auVar4._0_4_ * -auVar8._0_4_;
              auVar12._8_4_ = auVar4._8_4_ * -auVar8._8_4_;
              auVar12._12_4_ = auVar4._12_4_ * -auVar8._12_4_;
              auVar26 = vfmadd213ps_fma(auVar29,auVar4,auVar12);
              uVar2 = *(undefined4 *)(sVar17 + 0x60 + lVar16 * 4);
              auVar30._4_4_ = uVar2;
              auVar30._0_4_ = uVar2;
              auVar30._8_4_ = uVar2;
              auVar30._12_4_ = uVar2;
              auVar10 = vfmadd213ps_fma(auVar30,auVar31,auVar10);
              uVar2 = *(undefined4 *)(sVar17 + 0xa0 + lVar16 * 4);
              auVar32._4_4_ = uVar2;
              auVar32._0_4_ = uVar2;
              auVar32._8_4_ = uVar2;
              auVar32._12_4_ = uVar2;
              auVar11 = vfmadd213ps_fma(auVar32,auVar23,auVar11);
              uVar2 = *(undefined4 *)(sVar17 + 0xe0 + lVar16 * 4);
              auVar33._4_4_ = uVar2;
              auVar33._0_4_ = uVar2;
              auVar33._8_4_ = uVar2;
              auVar33._12_4_ = uVar2;
              auVar12 = vfmadd213ps_fma(auVar33,auVar4,auVar12);
              auVar22 = vpminsd_avx(auVar28,auVar10);
              auVar21 = vpminsd_avx(auVar24,auVar11);
              auVar22 = vpmaxsd_avx(auVar22,auVar21);
              auVar21 = vpminsd_avx(auVar26,auVar12);
              auVar21 = vpmaxsd_avx(auVar22,auVar21);
              auVar22 = vpmaxsd_avx(auVar28,auVar10);
              auVar28 = vpmaxsd_avx(auVar24,auVar11);
              auVar24 = vpminsd_avx(auVar22,auVar28);
              auVar22 = vpmaxsd_avx(auVar26,auVar12);
              auVar28 = vpmaxsd_avx(auVar21,(undefined1  [16])aVar5);
              auVar22 = vpminsd_avx(auVar22,(undefined1  [16])bi_8.field_0);
              auVar22 = vpminsd_avx(auVar24,auVar22);
              auVar22 = vcmpps_avx(auVar28,auVar22,2);
              sVar13 = sVar15;
              aVar6 = aVar19;
              if (((((auVar22 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar22 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar22 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar22[0xf] < '\0') &&
                 (aVar6.v = (__m128)vblendvps_avx(auVar37._0_16_,auVar21,auVar22), sVar13 = sVar3,
                 sVar15 != 8)) {
                pNVar14->ptr = sVar15;
                pNVar14 = pNVar14 + 1;
                *paVar18 = aVar19;
                paVar18 = paVar18 + 1;
              }
              aVar19 = aVar6;
              sVar15 = sVar13;
            }
            sVar17 = sVar15;
          } while (sVar15 != 8);
        }
        goto LAB_0164abd1;
      }
LAB_0164ae21:
      auVar7 = vandps_avx(auVar34,auVar9);
      auVar25._8_4_ = 0xff800000;
      auVar25._0_8_ = 0xff800000ff800000;
      auVar25._12_4_ = 0xff800000;
      auVar7 = vmaskmovps_avx(auVar7,auVar25);
      *(undefined1 (*) [16])(ray + 0x80) = auVar7;
    }
  }
  return;
  while( true ) {
    valid0.field_0 = aVar20;
    InstanceArrayIntersectorK<4>::occluded(local_34e8,&valid0,&pre,ray,context,prim);
    auVar22 = auVar35._0_16_;
    aVar20.v = (__m128)vandnps_avx((undefined1  [16])local_34e8,valid0.field_0);
    auVar21 = (undefined1  [16])valid0.field_0 & ~(undefined1  [16])local_34e8;
    prim = prim + 1;
    if ((((auVar21 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar21 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar21 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar21[0xf])
    break;
LAB_0164ad70:
    auVar22 = auVar35._0_16_;
    lVar16 = lVar16 + -1;
    if (lVar16 == 0) break;
  }
  auVar22 = vpcmpeqd_avx(auVar22,auVar22);
  auVar35 = ZEXT1664(auVar22);
  auVar21._0_4_ = auVar22._0_4_ ^ aVar20.i[0];
  auVar21._4_4_ = auVar22._4_4_ ^ aVar20.i[1];
  auVar21._8_4_ = auVar22._8_4_ ^ aVar20.i[2];
  auVar21._12_4_ = auVar22._12_4_ ^ aVar20.i[3];
  auVar34 = vorps_avx(auVar34,auVar21);
  auVar36 = ZEXT1664(auVar34);
  auVar22 = auVar22 & ~auVar34;
  if ((((auVar22 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar22 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar22 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar22[0xf])
  goto LAB_0164ae21;
  auVar22._8_4_ = 0xff800000;
  auVar22._0_8_ = 0xff800000ff800000;
  auVar22._12_4_ = 0xff800000;
  bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                 vblendvps_avx((undefined1  [16])bi_8.field_0,auVar22,auVar34);
  auVar37 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
  goto LAB_0164abd1;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }